

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_move16_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 arg1;
  uint16_t ext;
  TCGv_i32 tmp;
  int index;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = ((s->base).tb)->flags;
  uVar2 = read_im16(env,s);
  if ((uVar2 & 0x8000) == 0) {
    gen_exception(s,(s->base).pc_next,4);
  }
  pTVar3 = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
  pTVar4 = get_areg(s,insn & 7);
  m68k_copy_line(tcg_ctx_00,pTVar3,pTVar4,(uint)(((uVar1 & 0x2000) != 0 ^ 0xffU) & 1));
  pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
  pTVar4 = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
  tcg_gen_mov_i32(tcg_ctx_00,pTVar3,pTVar4);
  pTVar4 = get_areg(s,insn & 7);
  arg1 = get_areg(s,insn & 7);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar4,arg1,0x10);
  pTVar4 = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar4,pTVar3,0x10);
  tcg_temp_free_i32(tcg_ctx_00,pTVar3);
  return;
}

Assistant:

DISAS_INSN(move16_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv tmp;
    uint16_t ext;

    ext = read_im16(env, s);
    if ((ext & (1 << 15)) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
    }

    m68k_copy_line(tcg_ctx, AREG(ext, 12), AREG(insn, 0), index);

    /* Ax can be Ay, so save Ay before incrementing Ax */
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, tmp, AREG(ext, 12));
    tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), AREG(insn, 0), 16);
    tcg_gen_addi_i32(tcg_ctx, AREG(ext, 12), tmp, 16);
    tcg_temp_free(tcg_ctx, tmp);
}